

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

DisasJumpType op_absf128(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_andi_i64_s390x(tcg_ctx,o->out,o->in1,0x7fffffffffffffff);
  if (o->out2 != o->in2) {
    tcg_gen_op2_s390x(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(o->out2 + (long)tcg_ctx),
                      (TCGArg)(o->in2 + (long)tcg_ctx));
  }
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_absf128(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;

    tcg_gen_andi_i64(tcg_ctx, o->out, o->in1, 0x7fffffffffffffffull);
    tcg_gen_mov_i64(tcg_ctx, o->out2, o->in2);
    return DISAS_NEXT;
}